

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::scroll(QWidget *this,int dx,int dy,QRect *r)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  QWidgetPrivate *this_00;
  int iVar6;
  int iVar7;
  char cVar8;
  QGraphicsProxyWidget *this_01;
  undefined8 *puVar9;
  undefined8 *puVar10;
  QRect *rect;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  int iVar15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar16;
  undefined1 auVar14 [16];
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = this->data->widget_attributes;
  if (((((uVar5 >> 10 & 1) == 0) || (*(long *)(*(long *)&this->field_0x8 + 0x28) != 0)) &&
      (dy != 0 || dx != 0)) && ((uVar5 & 0x8000) != 0)) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    this_01 = (QGraphicsProxyWidget *)QWidgetPrivate::nearestGraphicsProxyWidget(this);
    if (this_01 == (QGraphicsProxyWidget *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidgetPrivate::scrollRect(this_00,r,dx,dy);
        return;
      }
      goto LAB_0030eaf2;
    }
    cVar8 = QRegion::isEmpty();
    if (cVar8 == '\0') {
      QRegion::translated((int)&local_58,(int)this_00 + 0xe0);
      QRegion::operator&((QRegion *)&local_78,(QRect *)&local_58);
      QRegion::~QRegion((QRegion *)&local_58);
      puVar9 = (undefined8 *)QRegion::begin();
      puVar10 = (undefined8 *)QRegion::end();
      if (puVar9 != puVar10) {
        do {
          iVar6 = (int)*puVar9;
          local_58.xp = (qreal)iVar6;
          iVar7 = (int)((ulong)*puVar9 >> 0x20);
          local_58.yp = (qreal)iVar7;
          local_58.w = (qreal)(((long)*(int *)(puVar9 + 1) - (long)iVar6) + 1);
          local_58.h = (qreal)(((long)*(int *)((long)puVar9 + 0xc) - (long)iVar7) + 1);
          QGraphicsItem::update((QGraphicsItem *)(this_01 + 0x10),&local_58);
          puVar9 = puVar9 + 2;
        } while (puVar9 != puVar10);
      }
      QRegion::~QRegion((QRegion *)&local_78);
    }
    QGraphicsProxyWidget::subWidgetRect(&local_78,this_01,this);
    auVar12._0_8_ =
         (double)((ulong)local_78.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_78.xp;
    auVar12._8_8_ =
         (double)((ulong)local_78.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_78.yp;
    auVar11 = minpd(_DAT_0066f5d0,auVar12);
    auVar11 = maxpd(auVar11,_DAT_0066f5e0);
    uVar1 = r->x1;
    uVar3 = r->y1;
    iVar15 = uVar1 + (int)auVar11._0_8_;
    auVar13._4_4_ = uVar3 + (int)auVar11._8_8_;
    uVar2 = r->x2;
    uVar4 = r->y2;
    iVar16 = uVar2 + (int)auVar11._0_8_;
    auVar14._4_4_ = uVar4 + (int)auVar11._8_8_;
    local_58.xp = (qreal)iVar15;
    local_58.yp = (qreal)auVar13._4_4_;
    auVar14._8_4_ = auVar14._4_4_;
    auVar14._12_4_ = -(uint)(auVar14._4_4_ < 0);
    auVar13._8_4_ = auVar13._4_4_;
    auVar13._12_4_ = -(uint)(auVar13._4_4_ < 0);
    auVar11._8_4_ = 0xffffffff;
    auVar11._0_8_ = 0xffffffffffffffff;
    auVar11._12_4_ = 0xffffffff;
    local_58.w = (qreal)((CONCAT44(-(uint)(iVar16 < 0),iVar16) -
                         CONCAT44(-(uint)(iVar15 < 0),iVar15)) + 1);
    local_58.h = (qreal)((auVar14._8_8_ - auVar13._8_8_) - auVar11._8_8_);
    QGraphicsItem::scroll((QGraphicsItem *)(this_01 + 0x10),(double)dx,(double)dy,&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0030eaf2:
  __stack_chk_fail();
}

Assistant:

void QWidget::scroll(int dx, int dy, const QRect &r)
{

    if ((!updatesEnabled() && children().size() == 0) || !isVisible())
        return;
    if (dx == 0 && dy == 0)
        return;
    Q_D(QWidget);
#if QT_CONFIG(graphicsview)
    if (QGraphicsProxyWidget *proxy = QWidgetPrivate::nearestGraphicsProxyWidget(this)) {
        // Graphics View maintains its own dirty region as a list of rects;
        // until we can connect item updates directly to the view, we must
        // separately add a translated dirty region.
        if (!d->dirty.isEmpty()) {
            for (const QRect &rect : d->dirty.translated(dx, dy) & r)
                proxy->update(rect);
        }
        proxy->scroll(dx, dy, r.translated(proxy->subWidgetRect(this).topLeft().toPoint()));
        return;
    }
#endif
    d->scroll_sys(dx, dy, r);
}